

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O2

MyDB_PageHandle __thiscall MyDB_BufferManager::getPage(MyDB_BufferManager *this)

{
  long *__y;
  unsigned_long *__y_00;
  size_t sVar1;
  undefined8 *puVar2;
  MyDB_PageBase *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MyDB_BufferManager *in_RSI;
  MyDB_PageHandle MVar3;
  pair<std::shared_ptr<MyDB_Table>,_long> curId;
  pair<std::shared_ptr<MyDB_Table>,_long> local_60;
  pair<std::shared_ptr<MyDB_Table>,_long> local_48;
  
  std::make_shared<MyDB_PageHandleBase>();
  __y_00 = (in_RSI->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((in_RSI->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur == __y_00) {
    __y = &in_RSI->curpos;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair<std::shared_ptr<MyDB_Table>_&,_long_&,_true>
              (&curId,&in_RSI->tempTable,__y);
    this_00 = (MyDB_PageBase *)operator_new(0x38);
    sVar1 = in_RSI->curpos;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_60,&curId);
    MyDB_PageBase::MyDB_PageBase(this_00,(void *)0x0,false,sVar1,false,0,&local_60,in_RSI);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    *__y = *__y + 1;
  }
  else {
    std::pair<std::shared_ptr<MyDB_Table>,_long>::
    pair<std::shared_ptr<MyDB_Table>_&,_unsigned_long_&,_true>(&curId,&in_RSI->tempTable,__y_00);
    this_00 = (MyDB_PageBase *)operator_new(0x38);
    sVar1 = *(in_RSI->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_48,&curId);
    MyDB_PageBase::MyDB_PageBase(this_00,(void *)0x0,false,sVar1,false,0,&local_48,in_RSI);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&(in_RSI->slotQueue).c);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&curId.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  puVar2 = *(undefined8 **)&(this->pageMap)._M_t._M_impl;
  *puVar2 = this_00;
  this_00->handleCount = this_00->handleCount + 1;
  puVar2[1] = in_RSI;
  MVar3.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar3.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar3.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPage () {

	// the handle we will return
	MyDB_PageHandle phd = make_shared<MyDB_PageHandleBase>();

	//New one page
	//If the slotQueue is not empty, then get slotId from the slotQueue
	MyDB_PageBase* newPage;
	if (!slotQueue.empty()) {
		// id for the anonymous page, offset equals to slot
		pair<MyDB_TablePtr, long> curId(tempTable, slotQueue.front());
		newPage = new MyDB_PageBase (nullptr, false, slotQueue.front(), false, 0, curId, this);
		slotQueue.pop();
	}
	//If the slotQueue is empty, means there is no slotId can be recycled, then use the curpos
	else{
		// id for the anonymous page, offset equals to slot
		pair<MyDB_TablePtr, long> curId(tempTable, curpos);
		newPage = new MyDB_PageBase (nullptr, false, curpos, false, 0, curId, this);
		curpos ++;
	}
	// Don't need to update the anonymous page into the pageMap
	phd -> pagePtr = newPage;

	phd -> pagePtr -> handleCount ++;
	phd->bufferManager = this;

	return phd;
}